

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

int __thiscall
pzgeom::TPZNodeRep<5,_pztopology::TPZPyramid>::ClassId(TPZNodeRep<5,_pztopology::TPZPyramid> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"TPZNodeRep",&local_31);
  uVar1 = Hash(&local_30);
  iVar2 = pztopology::TPZPyramid::ClassId(&this->super_TPZPyramid);
  std::__cxx11::string::~string((string *)&local_30);
  return uVar1 ^ iVar2 * 2 ^ 0x14;
}

Assistant:

int TPZNodeRep<N, Topology>::ClassId() const{
        return Hash("TPZNodeRep") ^ Topology::ClassId() << 1 ^ (N << 2);
    }